

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

QMdiSubWindow * __thiscall
QMdiArea::addSubWindow(QMdiArea *this,QWidget *widget,WindowFlags windowFlags)

{
  QMdiAreaPrivate *this_00;
  long lVar1;
  QPointer<QMdiSubWindow> *pQVar2;
  long lVar3;
  QWidget *this_01;
  QWidget *this_02;
  QWidget *pQVar4;
  long lVar5;
  
  if (widget == (QWidget *)0x0) {
    addSubWindow();
    this_02 = (QWidget *)0x0;
  }
  else {
    this_00 = *(QMdiAreaPrivate **)
               &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
    this_01 = QWidget::focusWidget(widget);
    this_02 = (QWidget *)QMetaObject::cast((QObject *)&QMdiSubWindow::staticMetaObject);
    if (this_02 == (QWidget *)0x0) {
      this_02 = (QWidget *)operator_new(0x28);
      pQVar4 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QMdiSubWindow::QMdiSubWindow((QMdiSubWindow *)this_02,pQVar4,windowFlags);
      QWidget::setAttribute(this_02,WA_DeleteOnClose,true);
      QMdiSubWindow::setWidget((QMdiSubWindow *)this_02,widget);
    }
    else {
      lVar1 = (this_00->childWindows).d.size;
      if (lVar1 != 0) {
        pQVar2 = (this_00->childWindows).d.ptr;
        lVar5 = 0;
        do {
          if (lVar1 << 4 == lVar5) goto LAB_00442541;
          lVar3 = *(long *)((long)&(pQVar2->wp).d + lVar5);
          if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
            pQVar4 = (QWidget *)0x0;
          }
          else {
            pQVar4 = *(QWidget **)((long)&(pQVar2->wp).value + lVar5);
          }
          lVar5 = lVar5 + 0x10;
        } while (pQVar4 != this_02);
        if (lVar5 != 0) {
          addSubWindow();
          return (QMdiSubWindow *)this_02;
        }
      }
LAB_00442541:
      pQVar4 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      if ((QFlagsStorage<Qt::WindowType>)
          windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i == (QFlagsStorage<Qt::WindowType>)0x0) {
        windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>
        .i = (QFlagsStorageHelper<Qt::WindowType,_4>)
             (this_02->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i;
      }
      QWidget::setParent(this_02,pQVar4,windowFlags);
    }
    QMdiAreaPrivate::appendChild(this_00,(QMdiSubWindow *)this_02);
    if (this_01 != (QWidget *)0x0) {
      QWidget::setFocus(this_01,OtherFocusReason);
    }
  }
  return (QMdiSubWindow *)this_02;
}

Assistant:

QMdiSubWindow *QMdiArea::addSubWindow(QWidget *widget, Qt::WindowFlags windowFlags)
{
    if (Q_UNLIKELY(!widget)) {
        qWarning("QMdiArea::addSubWindow: null pointer to widget");
        return nullptr;
    }

    Q_D(QMdiArea);
    // QWidget::setParent clears focusWidget so store it
    QWidget *childFocus = widget->focusWidget();
    QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(widget);

    // Widget is already a QMdiSubWindow
    if (child) {
        if (Q_UNLIKELY(d->childWindows.indexOf(child) != -1)) {
            qWarning("QMdiArea::addSubWindow: window is already added");
            return child;
        }
        child->setParent(viewport(), windowFlags ? windowFlags : child->windowFlags());
    // Create a QMdiSubWindow
    } else {
        child = new QMdiSubWindow(viewport(), windowFlags);
        child->setAttribute(Qt::WA_DeleteOnClose);
        child->setWidget(widget);
        Q_ASSERT(child->testAttribute(Qt::WA_DeleteOnClose));
    }

    d->appendChild(child);

    if (childFocus)
        childFocus->setFocus();

    return child;
}